

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

Limit __thiscall
google::protobuf::io::CodedInputStream::PushLimit(CodedInputStream *this,int byte_limit)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = this->current_limit_;
  if (((-1 < byte_limit) &&
      (uVar2 = (this->total_bytes_read_ - this->buffer_size_after_limit_) +
               (*(int *)&this->buffer_ - *(int *)&this->buffer_end_),
      (uint)byte_limit <= (uVar2 ^ 0x7fffffff))) && (byte_limit < (int)(iVar1 - uVar2))) {
    this->current_limit_ = uVar2 + byte_limit;
    RecomputeBufferLimits(this);
  }
  return iVar1;
}

Assistant:

CodedInputStream::Limit CodedInputStream::PushLimit(int byte_limit) {
  // Current position relative to the beginning of the stream.
  int current_position = CurrentPosition();

  Limit old_limit = current_limit_;

  // security: byte_limit is possibly evil, so check for negative values
  // and overflow. Also check that the new requested limit is before the
  // previous limit; otherwise we continue to enforce the previous limit.
  if (PROTOBUF_PREDICT_TRUE(byte_limit >= 0 &&
                            byte_limit <= INT_MAX - current_position &&
                            byte_limit < current_limit_ - current_position)) {
    current_limit_ = current_position + byte_limit;
    RecomputeBufferLimits();
  }

  return old_limit;
}